

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_reconfigure_protocol(oonf_rfc5444_protocol *protocol,uint16_t port,int ip_proto)

{
  list_entity *plVar1;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_rfc5444_interface *interf;
  int ip_proto_local;
  uint16_t port_local;
  oonf_rfc5444_protocol *protocol_local;
  
  if ((port != protocol->port) || (ip_proto != protocol->ip_proto)) {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      oonf_log(2,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x20f,0,0,
               "Reconfigure protocol %s to port %u and ip-protocol %d",protocol,port,ip_proto);
    }
    protocol->port = port;
    protocol->ip_proto = ip_proto;
    for (plVar1 = (protocol->_interface_tree).list_head.next;
        __tempptr = (list_entity *)&plVar1[-2].prev,
        plVar1->prev != (protocol->_interface_tree).list_head.prev; plVar1 = plVar1->next) {
      oonf_packet_remove_managed((oonf_packet_managed *)(plVar1 + 7),true);
      oonf_packet_add_managed((oonf_packet_managed *)(plVar1 + 7));
      if (port != 0) {
        oonf_rfc5444_reconfigure_interface
                  ((oonf_rfc5444_interface *)__tempptr,(oonf_packet_managed_config *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_reconfigure_protocol(struct oonf_rfc5444_protocol *protocol, uint16_t port, int ip_proto) {
  struct oonf_rfc5444_interface *interf;

  /* nothing to do? */
  if (port == protocol->port && ip_proto == protocol->ip_proto) {
    return;
  }

  OONF_INFO(LOG_RFC5444, "Reconfigure protocol %s to port %u and ip-protocol %d", protocol->name, port, ip_proto);

  /* store protocol port */
  protocol->port = port;
  protocol->ip_proto = ip_proto;

  avl_for_each_element(&protocol->_interface_tree, interf, _node) {
    oonf_packet_remove_managed(&interf->_socket, true);
    oonf_packet_add_managed(&interf->_socket);

    if (port) {
      oonf_rfc5444_reconfigure_interface(interf, NULL);
    }
  }
}